

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::decodeArray
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,size_t param_3,
          uint32_t *out,size_t *nvalue)

{
  NotEnoughStorage *this_00;
  ostream *this_01;
  long in_RCX;
  uint *in_RSI;
  long *in_RDI;
  ulong *in_R8;
  uint32_t i;
  size_t out_len;
  uint32_t numBlocks;
  uint32_t *initout;
  size_t in_stack_ffffffffffffff98;
  uint local_4c;
  long local_48;
  uint local_40;
  long local_30;
  ulong *local_28;
  long local_20;
  uint32_t *local_10;
  
  if (*in_R8 < (ulong)(*in_RSI << 7)) {
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&NotEnoughStorage::typeinfo,NotEnoughStorage::~NotEnoughStorage);
  }
  local_10 = in_RSI + 1;
  local_40 = *in_RSI;
  local_48 = 0;
  local_30 = in_RCX;
  local_28 = in_R8;
  local_20 = in_RCX;
  for (local_4c = 0; local_4c < local_40; local_4c = local_4c + 1) {
    local_10 = (uint32_t *)(**(code **)(*in_RDI + 0x58))(in_RDI,local_10,local_20,&local_48);
    local_20 = local_48 * 4 + local_20;
  }
  if (*local_28 < (ulong)(local_20 - local_30 >> 2)) {
    this_01 = std::operator<<((ostream *)&std::cerr,"possible buffer overrun");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  *local_28 = local_20 - local_30 >> 2;
  return local_10;
}

Assistant:

const uint32_t *
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeArray(
#ifndef NDEBUG
    const uint32_t *in, const size_t len, uint32_t *out, size_t &nvalue) {
#else
    const uint32_t *in, const size_t, uint32_t *out, size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  const uint32_t *const initout(out);

  if (BlockSize * (*in) > nvalue)
    throw NotEnoughStorage(*in);
  const uint32_t numBlocks = *in++;
  size_t out_len = 0;
  for (uint32_t i = 0; i < numBlocks; i++) {
    in = decodeBlock(in, out, out_len);
    out += out_len;
  }

  if (static_cast<size_t>(out - initout) > nvalue) {
    std::cerr << "possible buffer overrun" << std::endl;
  }
  ASSERT(in <= len + initin, in - initin << " " << len);

  nvalue = out - initout;
  assert(nvalue == numBlocks * BlockSize);
  return in;
}